

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_tests.c
# Opt level: O2

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_25/icsiii[P]embedded-abstract-message/vendor/cJSON/tests/compare_tests.c"
            );
  UnityDefaultTestRun(cjson_compare_should_compare_null_pointer_as_not_equal,
                      "cjson_compare_should_compare_null_pointer_as_not_equal",0xc1);
  UnityDefaultTestRun(cjson_compare_should_compare_invalid_as_not_equal,
                      "cjson_compare_should_compare_invalid_as_not_equal",0xc2);
  UnityDefaultTestRun(cjson_compare_should_compare_numbers,"cjson_compare_should_compare_numbers",
                      0xc3);
  UnityDefaultTestRun(cjson_compare_should_compare_booleans,"cjson_compare_should_compare_booleans",
                      0xc4);
  UnityDefaultTestRun(cjson_compare_should_compare_null,"cjson_compare_should_compare_null",0xc5);
  UnityDefaultTestRun(cjson_compare_should_not_accept_invalid_types,
                      "cjson_compare_should_not_accept_invalid_types",0xc6);
  UnityDefaultTestRun(cjson_compare_should_compare_strings,"cjson_compare_should_compare_strings",
                      199);
  UnityDefaultTestRun(cjson_compare_should_compare_raw,"cjson_compare_should_compare_raw",200);
  UnityDefaultTestRun(cjson_compare_should_compare_arrays,"cjson_compare_should_compare_arrays",0xc9
                     );
  UnityDefaultTestRun(cjson_compare_should_compare_objects,"cjson_compare_should_compare_objects",
                      0xca);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
    UNITY_BEGIN();

    RUN_TEST(cjson_compare_should_compare_null_pointer_as_not_equal);
    RUN_TEST(cjson_compare_should_compare_invalid_as_not_equal);
    RUN_TEST(cjson_compare_should_compare_numbers);
    RUN_TEST(cjson_compare_should_compare_booleans);
    RUN_TEST(cjson_compare_should_compare_null);
    RUN_TEST(cjson_compare_should_not_accept_invalid_types);
    RUN_TEST(cjson_compare_should_compare_strings);
    RUN_TEST(cjson_compare_should_compare_raw);
    RUN_TEST(cjson_compare_should_compare_arrays);
    RUN_TEST(cjson_compare_should_compare_objects);

    return UNITY_END();
}